

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConcatNDLayerParams::SerializeWithCachedSizes
          (ConcatNDLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->interleave_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
    return;
  }
  return;
}

Assistant:

void ConcatNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConcatNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool interleave = 2;
  if (this->interleave() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->interleave(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConcatNDLayerParams)
}